

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O1

string * __thiscall
AssemblyCode::CJumpNotEqualCommand::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CJumpNotEqualCommand *this)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  undefined8 uVar9;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  string local_48;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_48,&this->leftOperand);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,0x15fb00);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_98 = *plVar5;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar5;
    local_a8 = (long *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_a8);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_d8 = *puVar6;
    lStack_d0 = plVar3[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar6;
    local_e8 = (ulong *)*plVar3;
  }
  local_e0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  IRT::CTemp::ToString_abi_cxx11_(&local_c8,&this->rightOperand);
  uVar8 = 0xf;
  if (local_e8 != &local_d8) {
    uVar8 = local_d8;
  }
  if (uVar8 < local_c8._M_string_length + local_e0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar9 = local_c8.field_2._M_allocated_capacity;
    }
    if (local_c8._M_string_length + local_e0 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
      goto LAB_0014b4b9;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
LAB_0014b4b9:
  local_108 = &local_f8;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_f8 = *puVar1;
    uStack_f0 = puVar4[3];
  }
  else {
    local_f8 = *puVar1;
    local_108 = (undefined8 *)*puVar4;
  }
  local_100 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_108);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_78 = *plVar5;
    lStack_70 = plVar3[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar5;
    local_88 = (long *)*plVar3;
  }
  local_80 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_88,
                              (ulong)(this->super_AbstractJumpCommand).label._M_dataplus._M_p);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblyCode::CJumpNotEqualCommand::ToString( ) const {
    return "cmp " + leftOperand.ToString( ) + " " + rightOperand.ToString( ) + "\njne " + label + "\n";
}